

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O3

void __thiscall
pbrt::SummedAreaTable::SummedAreaTable(SummedAreaTable *this,Array2D<float> *values,Allocator alloc)

{
  int iVar1;
  int iVar2;
  int iVar3;
  float *pfVar4;
  double *pdVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  Bounds2i local_40;
  
  uVar8 = (values->extent).pMax.super_Tuple2<pbrt::Point2,_int>.y -
          (values->extent).pMin.super_Tuple2<pbrt::Point2,_int>.y;
  uVar6 = (values->extent).pMax.super_Tuple2<pbrt::Point2,_int>.x -
          (values->extent).pMin.super_Tuple2<pbrt::Point2,_int>.x;
  local_40.pMin.super_Tuple2<pbrt::Point2,_int>.x = (int)uVar6 >> 0x1f & uVar6;
  local_40.pMin.super_Tuple2<pbrt::Point2,_int>.y = (int)uVar8 >> 0x1f & uVar8;
  uVar7 = (ulong)uVar6;
  if ((int)uVar6 < 1) {
    uVar7 = 0;
  }
  uVar10 = (ulong)uVar8;
  if ((int)uVar8 < 1) {
    uVar10 = 0;
  }
  local_40.pMax.super_Tuple2<pbrt::Point2,_int> =
       (Tuple2<pbrt::Point2,_int>)(uVar7 | uVar10 << 0x20);
  Array2D<double>::Array2D(&this->sum,&local_40,alloc);
  iVar13 = (values->extent).pMin.super_Tuple2<pbrt::Point2,_int>.x;
  iVar1 = (values->extent).pMin.super_Tuple2<pbrt::Point2,_int>.y;
  iVar2 = (this->sum).extent.pMin.super_Tuple2<pbrt::Point2,_int>.x;
  iVar3 = (this->sum).extent.pMin.super_Tuple2<pbrt::Point2,_int>.y;
  pfVar4 = values->values;
  iVar12 = (values->extent).pMax.super_Tuple2<pbrt::Point2,_int>.x - iVar13;
  uVar6 = (this->sum).extent.pMax.super_Tuple2<pbrt::Point2,_int>.x - iVar2;
  iVar17 = iVar12 * iVar1 + iVar13;
  iVar9 = uVar6 * iVar3 + iVar2;
  iVar15 = -iVar9;
  pdVar5 = (this->sum).values;
  pdVar5[iVar15] = (double)pfVar4[-iVar17];
  if (1 < (int)uVar6) {
    iVar14 = -iVar9;
    lVar11 = (ulong)uVar6 - 1;
    iVar17 = -iVar17;
    do {
      iVar17 = iVar17 + 1;
      lVar18 = (long)iVar14;
      iVar14 = iVar14 + 1;
      lVar11 = lVar11 + -1;
      pdVar5[iVar14] = (double)pfVar4[iVar17] + pdVar5[lVar18];
    } while (lVar11 != 0);
  }
  uVar8 = (this->sum).extent.pMax.super_Tuple2<pbrt::Point2,_int>.y - iVar3;
  if (1 < (int)uVar8) {
    iVar17 = (1 - iVar3) * uVar6 - iVar2;
    lVar11 = (ulong)uVar8 - 1;
    iVar14 = (1 - iVar1) * iVar12 - iVar13;
    do {
      lVar19 = (long)iVar14;
      lVar18 = (long)iVar15;
      iVar14 = iVar14 + iVar12;
      iVar15 = iVar15 + uVar6;
      pdVar5[iVar17] = (double)pfVar4[lVar19] + pdVar5[lVar18];
      iVar17 = iVar17 + uVar6;
      lVar11 = lVar11 + -1;
    } while (lVar11 != 0);
    if (1 < (int)uVar8) {
      uVar7 = (ulong)uVar6;
      uVar16 = 1;
      uVar10 = (ulong)(uint)-iVar9;
      uVar20 = (ulong)((1 - iVar3) * uVar6 - iVar2);
      iVar13 = ((1 - iVar1) * iVar12 - iVar13) + 1;
      do {
        if (1 < (int)uVar6) {
          lVar11 = 0;
          do {
            iVar1 = (int)lVar11;
            iVar2 = (int)uVar10 + iVar1;
            lVar11 = lVar11 + 1;
            pdVar5[(int)uVar20 + 1 + iVar1] =
                 ((double)pfVar4[iVar13 + iVar1] + pdVar5[(int)uVar20 + iVar1] + pdVar5[iVar2 + 1])
                 - pdVar5[iVar2];
          } while (uVar7 - 1 != lVar11);
        }
        iVar13 = iVar13 + iVar12;
        uVar16 = uVar16 + 1;
        uVar20 = uVar20 + uVar7;
        uVar10 = uVar10 + uVar7;
      } while (uVar16 != uVar8);
    }
  }
  return;
}

Assistant:

SummedAreaTable(const Array2D<Float> &values, Allocator alloc = {})
        : sum(values.xSize(), values.ySize(), alloc) {
        sum(0, 0) = values(0, 0);
        // Compute sums along first scanline and column
        for (int x = 1; x < sum.xSize(); ++x)
            sum(x, 0) = values(x, 0) + sum(x - 1, 0);
        for (int y = 1; y < sum.ySize(); ++y)
            sum(0, y) = values(0, y) + sum(0, y - 1);

        // Compute sums for the remainder of the entries
        for (int y = 1; y < sum.ySize(); ++y)
            for (int x = 1; x < sum.xSize(); ++x)
                sum(x, y) =
                    (values(x, y) + sum(x - 1, y) + sum(x, y - 1) - sum(x - 1, y - 1));
    }